

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O2

void __thiscall RTIMUSettings::RTIMUSettings(RTIMUSettings *this,char *productType)

{
  size_t sVar1;
  
  RTIMUHal::RTIMUHal(&this->super_RTIMUHal);
  (this->super_RTIMUHal)._vptr_RTIMUHal = (_func_int **)&PTR__RTIMUHal_00128590;
  RTVector3::RTVector3(&this->m_compassCalMin);
  RTVector3::RTVector3(&this->m_compassCalMax);
  RTVector3::RTVector3(&this->m_compassCalEllipsoidOffset);
  RTVector3::RTVector3(&this->m_accelCalMin);
  RTVector3::RTVector3(&this->m_accelCalMax);
  RTVector3::RTVector3(&this->m_gyroBias);
  sVar1 = strlen(productType);
  if (sVar1 - 0xc9 < 0xffffffffffffff38) {
    fwrite("Product name too long or null - using default\n",0x2e,1,_stderr);
    builtin_strncpy(this->m_filename,"RTIMULib.ini",0xd);
  }
  else {
    sprintf(this->m_filename,"%s.ini",productType);
  }
  (*(this->super_RTIMUHal)._vptr_RTIMUHal[2])(this);
  return;
}

Assistant:

RTIMUSettings::RTIMUSettings(const char *productType)
{
    if ((strlen(productType) > 200) || (strlen(productType) == 0)) {
        HAL_ERROR("Product name too long or null - using default\n");
        strcpy(m_filename, "RTIMULib.ini");
    } else {
        sprintf(m_filename, "%s.ini", productType);
    }
    loadSettings();
}